

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(ConstraintsGroup *this,string *name)

{
  size_t __n;
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  int iVar4;
  size_type sVar5;
  string *psVar6;
  ulong uVar7;
  ostream *poVar8;
  bool bVar9;
  __normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
  __i;
  iterator __position;
  pointer psVar10;
  ostringstream errorMsg;
  long *local_1b8;
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  sVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::_M_erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)this->m_pimpl);
  if (sVar5 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Unable to find constraint named ",0x20);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("ConstraintsGroup","removeConstraint",(char *)local_1b8);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
    bVar9 = false;
  }
  else {
    __position._M_current =
         (this->m_pimpl->orderedIntervals).
         super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (__position._M_current ==
        (this->m_pimpl->orderedIntervals).
        super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar9 = false;
    }
    else {
      bVar9 = false;
      do {
        psVar6 = Constraint::name_abi_cxx11_
                           (((((__position._M_current)->
                              super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->constraint).
                            super___shared_ptr<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr);
        __n = psVar6->_M_string_length;
        if ((__n == name->_M_string_length) &&
           ((__n == 0 ||
            (iVar4 = bcmp((psVar6->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar4 == 0)))) {
          std::
          vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
          ::_M_erase(&this->m_pimpl->orderedIntervals,__position);
          bVar9 = true;
        }
        else {
          __position._M_current = __position._M_current + 1;
        }
        if (bVar9) goto LAB_0017650b;
      } while (__position._M_current !=
               (this->m_pimpl->orderedIntervals).
               super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (bVar9 == false) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Unable to find constraint named ",0x20);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(name->_M_dataplus)._M_p,name->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"on the ordered vector. This is most likely a bug.",0x31);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("ConstraintsGroup","removeConstraint",(char *)local_1b8);
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_198);
      std::ios_base::~ios_base(local_128);
    }
    else {
LAB_0017650b:
      psVar1 = (this->m_pimpl->orderedIntervals).
               super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (this->m_pimpl->orderedIntervals).
               super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (psVar1 != psVar2) {
        uVar7 = (long)psVar2 - (long)psVar1 >> 4;
        lVar3 = 0x3f;
        if (uVar7 != 0) {
          for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(std::__cxx11::string_const&)::__0>>
                  (psVar1,psVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)psVar2 - (long)psVar1 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(std::__cxx11::string_const&)::__0>>
                    (psVar1,psVar2);
        }
        else {
          psVar10 = psVar1 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Iter_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(std::__cxx11::string_const&)::__0>>
                    (psVar1,psVar10);
          for (; psVar10 != psVar2; psVar10 = psVar10 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>,__gnu_cxx::__ops::_Val_comp_iter<iDynTree::optimalcontrol::ConstraintsGroup::removeConstraint(std::__cxx11::string_const&)::__0>>
                      (psVar10);
          }
        }
      }
    }
  }
  return bVar9;
}

Assistant:

bool ConstraintsGroup::removeConstraint(const std::string& name)
        {
            if (!(m_pimpl->group.erase(name))) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to find constraint named "<<name<< std::endl;
                reportError("ConstraintsGroup", "removeConstraint", errorMsg.str().c_str());
                return false;
            }

            bool found = false;
            std::vector<TimedConstraint_ptr>::iterator it = m_pimpl->orderedIntervals.begin();
            while ((!found) && (it != m_pimpl->orderedIntervals.end())){
                if (it->get()->constraint->name() == name) {
                    m_pimpl->orderedIntervals.erase(it);
                    found = true;
                } else {
                    ++it;
                }
            }

            if (!found) {
                std::ostringstream errorMsg;
                errorMsg << "Unable to find constraint named "<<name<< "on the ordered vector. This is most likely a bug." << std::endl;
                reportError("ConstraintsGroup", "removeConstraint", errorMsg.str().c_str());
                return false;
            }

            std::sort(m_pimpl->orderedIntervals.begin(), m_pimpl->orderedIntervals.end(), [](const TimedConstraint_ptr&a, const TimedConstraint_ptr&b) { return a->timeRange < b->timeRange;}); //reorder the vector
            return true;
        }